

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void runTest<main::__5>(char *param_1,byte param_2)

{
  void *this;
  ostream *poVar1;
  anon_class_1_0_00000001 *in_stack_000000b0;
  
  std::operator<<((ostream *)&std::cout,"[");
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),2);
  this = (void *)std::ostream::operator<<(&std::cout,std::right);
  testNo = testNo + 1;
  poVar1 = (ostream *)std::ostream::operator<<(this,testNo);
  std::operator<<(poVar1,"] ");
  std::ios_base::width((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0x28);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::left);
  poVar1 = std::operator<<(poVar1,param_1);
  std::operator<<(poVar1," ... ");
  std::ostream::flush();
  if ((param_2 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SKIPPED");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    skipped = skipped + 1;
  }
  else {
    main::anon_class_1_0_00000001::operator()(in_stack_000000b0);
    poVar1 = std::operator<<((ostream *)&std::cout,"PASSED");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void runTest(const char* name, bool condition, FUNC f) {
	std::cout << "[";
	std::cout.width(2);
	std::cout << std::right << ++testNo << "] ";
	std::cout.width(40);
	std::cout << std::left << name << " ... ";
	std::cout.flush();
	if (condition) {
		f();
		std::cout << "PASSED" << std::endl;
	}
	else {
		std::cout << "SKIPPED" << std::endl;
		skipped++;
	}
}